

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall TokenSequenceParser::parse(TokenSequenceParser *this,Parser *parser,int *result)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference this_00;
  Tokenizer *pTVar5;
  reference pTVar6;
  pointer pTVar7;
  Identifier *second;
  char *pcVar8;
  bool local_d9;
  bool local_c9;
  __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
  local_c0;
  TokenSequenceValue *local_b8;
  __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
  local_b0;
  TokenSequenceValue *local_a8;
  string_view local_a0;
  __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
  local_90;
  Token *local_88;
  Token *token;
  iterator iStack_78;
  TokenType type;
  iterator __end2;
  iterator __begin2;
  vector<TokenType,_std::allocator<TokenType>_> *__range2;
  iterator iStack_58;
  bool valid;
  iterator values;
  TokenizerPosition pos;
  Entry *entry;
  iterator __end1;
  iterator __begin1;
  vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_> *__range1;
  int *result_local;
  Parser *parser_local;
  TokenSequenceParser *this_local;
  
  __end1 = std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>::
           begin(&this->entries);
  entry = (Entry *)std::
                   vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>::
                   end(&this->entries);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<TokenSequenceParser::Entry_*,_std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>_>
                                *)&entry);
    if (!bVar2) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<TokenSequenceParser::Entry_*,_std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>_>
              ::operator*(&__end1);
    pTVar5 = Parser::getTokenizer(parser);
    values._M_current = (TokenSequenceValue *)Tokenizer::getPosition(pTVar5);
    iStack_58 = std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::begin
                          (&this_00->values);
    bVar2 = true;
    __end2 = std::vector<TokenType,_std::allocator<TokenType>_>::begin(&this_00->tokens);
    iStack_78 = std::vector<TokenType,_std::allocator<TokenType>_>::end(&this_00->tokens);
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff88), bVar3) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<TokenType_*,_std::vector<TokenType,_std::allocator<TokenType>_>_>::
               operator*(&__end2);
      token._4_4_ = *pTVar6;
      local_88 = Parser::nextToken(parser);
      if (local_88->type != token._4_4_) {
        bVar2 = false;
        break;
      }
      if (token._4_4_ == Identifier) {
        local_90._M_current =
             (TokenSequenceValue *)
             std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::end
                       (&this_00->values);
        bVar3 = __gnu_cxx::operator==(&stack0xffffffffffffffa8,&local_90);
        local_c9 = true;
        if (!bVar3) {
          pTVar7 = __gnu_cxx::
                   __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
                   ::operator->(&stack0xffffffffffffffa8);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_a0,(pTVar7->field_1).textValue);
          second = Token::identifierValue(local_88);
          local_c9 = ::operator!=(local_a0,second);
        }
        if (local_c9 != false) {
          bVar2 = false;
          break;
        }
        local_a8 = (TokenSequenceValue *)
                   __gnu_cxx::
                   __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
                   ::operator++(&stack0xffffffffffffffa8,0);
      }
      else if (token._4_4_ == Integer) {
        local_b0._M_current =
             (TokenSequenceValue *)
             std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::end
                       (&this_00->values);
        bVar4 = __gnu_cxx::operator==(&stack0xffffffffffffffa8,&local_b0);
        bVar3 = true;
        if (!bVar4) {
          pTVar7 = __gnu_cxx::
                   __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
                   ::operator->(&stack0xffffffffffffffa8);
          pcVar1 = (pTVar7->field_1).textValue;
          pcVar8 = (char *)Token::intValue(local_88);
          bVar3 = pcVar1 != pcVar8;
        }
        if (bVar3) {
          bVar2 = false;
          break;
        }
        local_b8 = (TokenSequenceValue *)
                   __gnu_cxx::
                   __normal_iterator<TokenSequenceValue_*,_std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>_>
                   ::operator++(&stack0xffffffffffffffa8,0);
      }
      __gnu_cxx::__normal_iterator<TokenType_*,_std::vector<TokenType,_std::allocator<TokenType>_>_>
      ::operator++(&__end2);
    }
    local_d9 = false;
    if (bVar2) {
      local_c0._M_current =
           (TokenSequenceValue *)
           std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::end
                     (&this_00->values);
      local_d9 = __gnu_cxx::operator==(&stack0xffffffffffffffa8,&local_c0);
    }
    if (local_d9 != false) {
      *result = this_00->result;
      return true;
    }
    pTVar5 = Parser::getTokenizer(parser);
    Tokenizer::setPosition(pTVar5,(TokenizerPosition)values._M_current);
    __gnu_cxx::
    __normal_iterator<TokenSequenceParser::Entry_*,_std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool TokenSequenceParser::parse(Parser& parser, int& result)
{
	for (Entry& entry: entries)
	{
		TokenizerPosition pos = parser.getTokenizer()->getPosition();
		auto values = entry.values.begin();

		bool valid = true;
		for (TokenType type: entry.tokens)
		{
			// check of token type matches
			const Token& token = parser.nextToken();
			if (token.type != type)
			{
				valid = false;
				break;
			}

			// if necessary, check if the value of the token also matches
			if (type == TokenType::Identifier)
			{
				if (values == entry.values.end() || values->textValue != token.identifierValue())
				{
					valid = false;
					break;
				}
				
				values++;
			} else if (type == TokenType::Integer)
			{
				if (values == entry.values.end() || values->intValue != token.intValue())
				{
					valid = false;
					break;
				}
				
				values++;
			} 
		}

		if (valid && values == entry.values.end())
		{
			result = entry.result;
			return true;
		}

		parser.getTokenizer()->setPosition(pos);
	}

	return false;
}